

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O1

lzham_decompress_state_ptr lzham::lzham_lib_decompress_init(lzham_decompress_params *pParams)

{
  int iVar1;
  lzham_uint32 lVar2;
  lzham_bool lVar3;
  lzham_bool lVar4;
  lzham_decompressor *this;
  void *pvVar5;
  lzham_decompressor *this_00;
  uint8 *puVar6;
  long lVar7;
  
  if (((pParams != (lzham_decompress_params *)0x0) && (pParams->m_struct_size == 0x10)) &&
     (0xfffffff0 < pParams->m_dict_size_log2 - 0x1e)) {
    this = (lzham_decompressor *)lzham_malloc(0x4fa8,(size_t *)0x0);
    this_00 = (lzham_decompressor *)0x0;
    if (this != (lzham_decompressor *)0x0) {
      lzham_decompressor::lzham_decompressor(this);
      this_00 = this;
    }
    if (this_00 != (lzham_decompressor *)0x0) {
      lVar2 = pParams->m_dict_size_log2;
      lVar3 = pParams->m_output_unbuffered;
      lVar4 = pParams->m_compute_adler32;
      (this_00->m_params).m_struct_size = pParams->m_struct_size;
      (this_00->m_params).m_dict_size_log2 = lVar2;
      (this_00->m_params).m_output_unbuffered = lVar3;
      (this_00->m_params).m_compute_adler32 = lVar4;
      if ((this_00->m_params).m_output_unbuffered == 0) {
        lVar7 = 1L << ((byte)(this_00->m_params).m_dict_size_log2 & 0x3f);
        puVar6 = (uint8 *)0x0;
        pvVar5 = lzham_malloc(lVar7 + 0x1f,(size_t *)0x0);
        if (pvVar5 != (void *)0x0) {
          iVar1 = (int)lVar7;
          puVar6 = (uint8 *)((long)pvVar5 + 0x10);
          *(int *)((long)pvVar5 + 0xc) = iVar1 + 0xf;
          *(int *)((long)pvVar5 + 8) = -0x10 - iVar1;
        }
        this_00->m_pRaw_decomp_buf = puVar6;
        if (puVar6 == (uint8 *)0x0) {
          lzham_decompressor::~lzham_decompressor(this_00);
          lzham_free(this_00);
          return (lzham_decompress_state_ptr)0x0;
        }
        this_00->m_pDecomp_buf = (uint8 *)((ulong)(puVar6 + 0xf) & 0xfffffffffffffff0);
      }
      else {
        this_00->m_pRaw_decomp_buf = (uint8 *)0x0;
        this_00->m_pDecomp_buf = (uint8 *)0x0;
      }
      CLZDecompBase::init_position_slots(&this_00->m_lzBase,(this_00->m_params).m_dict_size_log2);
      this_00->m_state = 0;
      this_00->m_status = LZHAM_DECOMP_STATUS_NOT_FINISHED;
      this_00->m_pIn_buf = (uint8 *)0x0;
      this_00->m_pIn_buf_size = (size_t *)0x0;
      this_00->m_pOut_buf = (uint8 *)0x0;
      this_00->m_pOut_buf_size = (size_t *)0x0;
      this_00->m_no_more_input_bytes_flag = false;
      this_00->m_pOrig_out_buf = (uint8 *)0x0;
      this_00->m_orig_out_buf_size = 0;
      this_00->m_dst_ofs = 0;
      this_00->m_step = 0;
      this_00->m_block_step = 0;
      this_00->m_initial_step = 0;
      this_00->m_block_index = 0;
      this_00->m_decomp_adler32 = 1;
      return this_00;
    }
  }
  return (lzham_decompress_state_ptr)0x0;
}

Assistant:

lzham_decompress_state_ptr lzham_lib_decompress_init(const lzham_decompress_params *pParams)
   {
      LZHAM_ASSUME(CLZDecompBase::cMinDictSizeLog2 == LZHAM_MIN_DICT_SIZE_LOG2);
      LZHAM_ASSUME(CLZDecompBase::cMaxDictSizeLog2 == LZHAM_MAX_DICT_SIZE_LOG2_X64);

      if ((!pParams) || (pParams->m_struct_size != sizeof(lzham_decompress_params)))
         return NULL;

      if ((pParams->m_dict_size_log2 < CLZDecompBase::cMinDictSizeLog2) || (pParams->m_dict_size_log2 > CLZDecompBase::cMaxDictSizeLog2))
         return NULL;

      lzham_decompressor *pState = lzham_new<lzham_decompressor>();
      if (!pState)
         return NULL;

      pState->m_params = *pParams;

      if (pState->m_params.m_output_unbuffered)
      {
         pState->m_pRaw_decomp_buf = NULL;
         pState->m_pDecomp_buf = NULL;
      }
      else
      {
         pState->m_pRaw_decomp_buf = lzham_new_array<uint8>(static_cast<uint32>(1U << pState->m_params.m_dict_size_log2) + 15);
         if (!pState->m_pRaw_decomp_buf)
         {
            lzham_delete(pState);
            return NULL;
         }
         pState->m_pDecomp_buf = math::align_up_pointer(pState->m_pRaw_decomp_buf, 16);
      }

      pState->init();

      return pState;
   }